

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu.cpp
# Opt level: O1

int __thiscall ncnn::SELU::forward_inplace(SELU *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  float fVar10;
  
  iVar3 = bottom_top_blob->c;
  if (0 < (long)iVar3) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w;
    fVar1 = this->lambda;
    fVar2 = this->alpha;
    pvVar9 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->cstep;
    sVar5 = bottom_top_blob->elemsize;
    lVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar7 = 0;
        do {
          fVar10 = *(float *)((long)pvVar9 + uVar7 * 4);
          if (0.0 <= fVar10) {
            fVar10 = fVar10 * this->lambda;
          }
          else {
            fVar10 = expf(fVar10);
            fVar10 = (fVar10 + -1.0) * fVar1 * fVar2;
          }
          *(float *)((long)pvVar9 + uVar7 * 4) = fVar10;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      lVar8 = lVar8 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
    } while (lVar8 != iVar3);
  }
  return 0;
}

Assistant:

int SELU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
    float alphaxlambda = alpha * lambda;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < 0.f)
                ptr[i] = static_cast<float>((exp(ptr[i]) - 1.f) * alphaxlambda);
            else
                ptr[i] *= lambda;
        }
    }

    return 0;
}